

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::ContinueString_Size(VmaJsonWriter *this,size_t n)

{
  VmaStringBuilder *this_00;
  bool bVar1;
  byte *pStr;
  byte local_5 [5];
  
  this_00 = this->m_SB;
  pStr = local_5 + 1;
  local_5[1] = 0;
  do {
    pStr[-1] = (char)n + (char)(n / 10) * -10 | 0x30;
    pStr = pStr + -1;
    bVar1 = 9 < n;
    n = n / 10;
  } while (bVar1);
  VmaStringBuilder::Add(this_00,(char *)pStr);
  return;
}

Assistant:

void VmaJsonWriter::ContinueString_Size(size_t n)
{
    VMA_ASSERT(m_InsideString);
    // Fix for AppleClang incorrect type casting
    // TODO: Change to if constexpr when C++17 used as minimal standard
    WriteSize(n, std::is_same<size_t, uint64_t>{});
}